

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

bool __thiscall
QMimeBinaryProvider::matchSuffixTree
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,
          int numEntries,int firstOffset,QString *fileName,qsizetype charPos,bool caseSensitiveCheck
          )

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  quint32 qVar4;
  quint32 qVar5;
  uint uVar6;
  QStringBuilder<char16_t,_QStringView> *pQVar7;
  int in_ECX;
  QMimeGlobMatchResult *in_RDX;
  QMimeBinaryProvider *in_RSI;
  undefined4 in_R8D;
  QString *in_R9;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  long in_stack_00000008;
  undefined1 in_stack_00000010;
  bool caseSensitive;
  int weight;
  int flagsAndWeight;
  int mimeTypeOffset;
  int mch;
  int childOff;
  int i;
  bool success;
  int childrenOffset;
  int numChildren;
  int off;
  int mid;
  int max;
  int min;
  QLatin1StringView mimeType;
  QChar ch;
  QChar fileChar;
  QStringBuilder<char16_t,_QStringView> *in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  QMimeProviderBase *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe80;
  undefined1 *puVar8;
  undefined7 in_stack_fffffffffffffe98;
  byte in_stack_fffffffffffffe9f;
  int local_134;
  bool local_12d;
  undefined1 caseSensitiveCheck_00;
  int iVar9;
  undefined3 in_stack_fffffffffffffeec;
  uint uVar10;
  QMimeBinaryProvider *pQVar11;
  bool local_e1;
  undefined1 local_e0 [16];
  QStringView local_d0;
  undefined2 local_ba;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 local_40 [24];
  undefined1 *local_28;
  undefined1 *puStack_20;
  QChar local_c;
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = CONCAT13(in_stack_00000010,in_stack_fffffffffffffeec) & 0x1ffffff;
  local_a = 0xaaaa;
  local_a = (char16_t)
            QString::operator[]((QString *)in_stack_fffffffffffffe68,
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  iVar9 = 0;
  iVar2 = in_ECX + -1;
LAB_008f9da8:
  do {
    if (iVar2 < iVar9) {
      local_e1 = false;
LAB_008fa241:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_e1;
    }
    iVar3 = (iVar9 + iVar2) / 2;
    local_c.ucs = L'ꪪ';
    qVar4 = CacheFile::getUint32
                      ((CacheFile *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    QChar::QChar<char16_t,_true>(&local_c,(char16_t)qVar4);
    bVar1 = ::operator<((QChar *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (QChar *)in_stack_fffffffffffffe58);
    if (!bVar1) {
      bVar1 = operator>((QChar *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (QChar *)in_stack_fffffffffffffe58);
      caseSensitiveCheck_00 = (undefined1)((uint)iVar2 >> 0x18);
      if (!bVar1) {
        pQVar7 = (QStringBuilder<char16_t,_QStringView> *)(in_stack_00000008 + -1);
        qVar4 = CacheFile::getUint32
                          ((CacheFile *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        CacheFile::getUint32
                  ((CacheFile *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        local_12d = false;
        if (0 < (long)pQVar7) {
          in_stack_fffffffffffffe60 = (uint)((byte)(uVar10 >> 0x18) & 1);
          local_12d = matchSuffixTree(in_RSI,in_RDX,(CacheFile *)CONCAT44(in_ECX,in_R8D),
                                      (int)((ulong)in_R9 >> 0x20),(int)in_R9,
                                      (QString *)CONCAT44(uVar10,iVar9),unaff_retaddr,
                                      (bool)caseSensitiveCheck_00);
          in_stack_fffffffffffffe58 = pQVar7;
        }
        if (local_12d == false) {
          local_134 = 0;
          while ((local_134 < (int)qVar4 &&
                 (qVar5 = CacheFile::getUint32
                                    ((CacheFile *)
                                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                     (int)((ulong)in_stack_fffffffffffffe58 >> 0x20)), qVar5 == 0)))
          {
            qVar5 = CacheFile::getUint32
                              ((CacheFile *)
                               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
            local_28 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
            CacheFile::getCharStar((CacheFile *)in_RDX,qVar5);
            QLatin1String::QLatin1String
                      ((QLatin1String *)
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       (char *)in_stack_fffffffffffffe68);
            local_58 = local_28;
            puStack_50 = puStack_20;
            puVar8 = local_40;
            latin1.m_data._0_7_ = in_stack_fffffffffffffe98;
            latin1.m_size = (qsizetype)puVar8;
            latin1.m_data._7_1_ = in_stack_fffffffffffffe9f;
            QString::QString((QString *)
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),latin1);
            in_stack_fffffffffffffe9f =
                 QMimeProviderBase::isMimeTypeGlobsExcluded
                           (in_stack_fffffffffffffe68,
                            (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                           );
            QString::~QString((QString *)0x8fa023);
            pQVar11 = in_RSI;
            if ((in_stack_fffffffffffffe9f & 1) == 0) {
              qVar5 = CacheFile::getUint32
                                ((CacheFile *)
                                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
              uVar6 = qVar5 & 0xff;
              pQVar11 = in_RSI;
              if (((uVar10 & 0x1000000) != 0) || ((qVar5 & 0x100) == 0)) {
                local_88 = local_28;
                puStack_80 = puStack_20;
                latin1_00.m_data._0_7_ = in_stack_fffffffffffffe98;
                latin1_00.m_size = (qsizetype)puVar8;
                latin1_00.m_data._7_1_ = in_stack_fffffffffffffe9f;
                QString::QString((QString *)
                                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                 latin1_00);
                local_ba = 0x2a;
                puVar8 = local_e0;
                QStringView::QStringView<QString,_true>
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           (QString *)in_stack_fffffffffffffe68);
                local_d0 = QStringView::mid((QStringView *)in_RSI,(qsizetype)puVar8,
                                            CONCAT44(uVar6,in_stack_fffffffffffffe80));
                ::operator+((char16_t *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (QStringView *)in_stack_fffffffffffffe58);
                ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe58);
                QString::size(in_R9);
                QMimeGlobMatchResult::addMatch
                          ((QMimeGlobMatchResult *)CONCAT44(uVar6,in_stack_fffffffffffffe80),
                           (QString *)in_RSI,in_stack_fffffffffffffe74,
                           (QString *)in_stack_fffffffffffffe68,
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
                QString::~QString((QString *)0x8fa1b9);
                QString::~QString((QString *)0x8fa1c6);
                local_12d = true;
              }
            }
            local_134 = local_134 + 1;
            in_RSI = pQVar11;
          }
        }
        local_e1 = local_12d;
        goto LAB_008fa241;
      }
      iVar2 = iVar3 + -1;
      goto LAB_008f9da8;
    }
    iVar9 = iVar3 + 1;
  } while( true );
}

Assistant:

bool QMimeBinaryProvider::matchSuffixTree(QMimeGlobMatchResult &result,
                                          QMimeBinaryProvider::CacheFile *cacheFile, int numEntries,
                                          int firstOffset, const QString &fileName,
                                          qsizetype charPos, bool caseSensitiveCheck)
{
    QChar fileChar = fileName[charPos];
    int min = 0;
    int max = numEntries - 1;
    while (min <= max) {
        const int mid = (min + max) / 2;
        const int off = firstOffset + 12 * mid;
        const QChar ch = char16_t(cacheFile->getUint32(off));
        if (ch < fileChar)
            min = mid + 1;
        else if (ch > fileChar)
            max = mid - 1;
        else {
            --charPos;
            int numChildren = cacheFile->getUint32(off + 4);
            int childrenOffset = cacheFile->getUint32(off + 8);
            bool success = false;
            if (charPos > 0)
                success = matchSuffixTree(result, cacheFile, numChildren, childrenOffset, fileName, charPos, caseSensitiveCheck);
            if (!success) {
                for (int i = 0; i < numChildren; ++i) {
                    const int childOff = childrenOffset + 12 * i;
                    const int mch = cacheFile->getUint32(childOff);
                    if (mch != 0)
                        break;
                    const int mimeTypeOffset = cacheFile->getUint32(childOff + 4);
                    const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
                    if (isMimeTypeGlobsExcluded(mimeType))
                        continue;
                    const int flagsAndWeight = cacheFile->getUint32(childOff + 8);
                    const int weight = flagsAndWeight & 0xff;
                    const bool caseSensitive = flagsAndWeight & 0x100;
                    if (caseSensitiveCheck || !caseSensitive) {
                        result.addMatch(mimeType, weight,
                                        u'*' + QStringView{ fileName }.mid(charPos + 1),
                                        fileName.size() - charPos - 2);
                        success = true;
                    }
                }
            }
            return success;
        }
    }
    return false;
}